

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.h
# Opt level: O0

void __thiscall
hedg::Stream_Client::
send<boost::asio::basic_streambuf<std::allocator<char>>&,hedg::params::stream_authenticate>
          (Stream_Client *this,
          _func_void_basic_streambuf<std::allocator<char>_>_ptr_stream_authenticate *f,
          stream_authenticate *p)

{
  stream_authenticate sVar1;
  basic_streambuf<std::allocator<char>_> *pbVar2;
  stream_authenticate *this_00;
  stream_authenticate local_40;
  stream_authenticate *local_20;
  stream_authenticate *p_local;
  _func_void_basic_streambuf<std::allocator<char>_>_ptr_stream_authenticate *f_local;
  Stream_Client *this_local;
  
  pbVar2 = &(this->super_Client<hedg::Stream_Client>).inp_buff_;
  this_00 = &local_40;
  local_20 = p;
  p_local = (stream_authenticate *)f;
  f_local = (_func_void_basic_streambuf<std::allocator<char>_>_ptr_stream_authenticate *)this;
  params::stream_authenticate::stream_authenticate(this_00,p);
  sVar1.session_id._M_string_length = (size_type)this;
  sVar1.session_id._0_8_ = p;
  sVar1.session_id.field_2._M_allocated_capacity = (size_type)pbVar2;
  sVar1.session_id.field_2._8_8_ = this_00;
  (*f)(pbVar2,sVar1);
  params::stream_authenticate::~stream_authenticate(&local_40);
  boost::asio::
  write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
            (&(this->super_Client<hedg::Stream_Client>).sock_,
             &(this->super_Client<hedg::Stream_Client>).inp_buff_);
  return;
}

Assistant:

void send(void(*f)(Buff, T), T p) {
		f(inp_buff_, p);
		boost::asio::write(sock_, inp_buff_);
	}